

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdir-posix.c
# Opt level: O2

pboolean p_dir_create(pchar *path,pint mode,PError **error)

{
  pboolean pVar1;
  int iVar2;
  PErrorIO code;
  pint native_code;
  pboolean pVar3;
  
  if (path == (pchar *)0x0) {
    pVar3 = 0;
    p_error_set_error_p(error,0x1fb,0,"Invalid input argument");
  }
  else {
    pVar1 = p_dir_is_exists(path);
    pVar3 = 1;
    if (pVar1 == 0) {
      iVar2 = mkdir(path,mode);
      if (iVar2 != 0) {
        code = p_error_get_last_io();
        native_code = p_error_get_last_system();
        p_error_set_error_p(error,code,native_code,"Failed to call mkdir() to create directory");
        pVar3 = 0;
      }
    }
  }
  return pVar3;
}

Assistant:

P_LIB_API pboolean
p_dir_create (const pchar	*path,
	      pint		mode,
	      PError		**error)
{
	if (P_UNLIKELY (path == NULL)) {
		p_error_set_error_p (error,
				     (pint) P_ERROR_IO_INVALID_ARGUMENT,
				     0,
				     "Invalid input argument");
		return FALSE;
	}

	if (p_dir_is_exists (path))
		return TRUE;

	if (P_UNLIKELY (mkdir (path, (mode_t) mode) != 0)) {
		p_error_set_error_p (error,
				     (pint) p_error_get_last_io (),
				     p_error_get_last_system (),
				     "Failed to call mkdir() to create directory");
		return FALSE;
	} else
		return TRUE;
}